

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::CastToInt(VirtualMachine *this)

{
  element_type *peVar1;
  longlong val;
  anon_union_8_6_52c89740_for_Variable_1 __str;
  Variable VVar2;
  string local_38;
  allocator<char> local_11;
  
  VVar2 = popOpStack(this);
  __str = VVar2.field_1;
  switch(VVar2.type) {
  case Undefined:
  case Boolean:
  case Object:
  case Function:
    pushUndefined(this);
    goto LAB_00118536;
  case Integer:
    break;
  case Float:
    __str.integerValue = (int64_t)__str.doubleValue;
    break;
  case String:
    val = std::__cxx11::stoll(__str.stringValue,(size_t *)0x0,10);
    pushInteger(this,val);
    goto LAB_00118536;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unknown varible type at variableEquals",&local_11);
    panic(this,&local_38);
  }
  pushInteger(this,__str.integerValue);
LAB_00118536:
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::CastToInt() {
  Variable top = this->popOpStack();

  switch (top.type) {
    case VariableType::Integer: {
      this->pushInteger(top.integerValue);
      break;
    }
    case VariableType::Float: {
      this->pushInteger(static_cast<std::int64_t>(top.doubleValue));
      break;
    }
    case VariableType::Function: {
      this->pushUndefined();
      break;
    }
    case VariableType::Object: {
      this->pushUndefined();
      break;
    }
    case VariableType::String: {
      try {
        std::int64_t val = std::stoll(*top.stringValue);
        this->pushInteger(val);

      } catch (...) {
        this->pushUndefined();
      }
      break;
    }
    case VariableType::Undefined: {
      this->pushUndefined();
      break;
    }
    case VariableType::Boolean: {
      this->pushUndefined();
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->advance();
}